

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aigUtil.c
# Opt level: O2

void Aig_ObjPrintVerilog(FILE *pFile,Aig_Obj_t *pObj,Vec_Vec_t *vLevels,int Level)

{
  int iVar1;
  uint uVar2;
  Vec_Ptr_t *pVVar3;
  void *pvVar4;
  char *pcVar5;
  char *pcVar6;
  uint uVar7;
  Aig_Obj_t *pAVar8;
  Aig_Obj_t *pFanin1;
  Aig_Obj_t *pFanin0;
  char *local_38;
  
  uVar7 = (uint)pObj;
  pAVar8 = (Aig_Obj_t *)((ulong)pObj & 0xfffffffffffffffe);
  iVar1 = Aig_ObjIsConst1(pAVar8);
  if (iVar1 != 0) {
    fprintf((FILE *)pFile,"1\'b%d",(ulong)(uVar7 & 1 ^ 1));
    return;
  }
  uVar2 = (uint)*(undefined8 *)&pAVar8->field_0x18 & 7;
  if (uVar2 == 6) {
    Vec_VecExpand(vLevels,Level);
    pVVar3 = Vec_VecEntry(vLevels,Level);
    Aig_ObjCollectMulti(pAVar8,pVVar3);
    pcVar5 = "(";
    if (Level == 0) {
      pcVar5 = "";
    }
    fputs(pcVar5,(FILE *)pFile);
    for (iVar1 = 0; iVar1 < pVVar3->nSize; iVar1 = iVar1 + 1) {
      pvVar4 = Vec_PtrEntry(pVVar3,iVar1);
      Aig_ObjPrintVerilog(pFile,(Aig_Obj_t *)
                                ((ulong)(iVar1 == 0 & (byte)(uVar7 & 1)) ^ (ulong)pvVar4),vLevels,
                          Level + 1);
      if (iVar1 < pVVar3->nSize + -1) {
        fwrite(" ^ ",3,1,(FILE *)pFile);
      }
    }
  }
  else {
    if (uVar2 == 2) {
      pcVar5 = "~";
      if (((ulong)pObj & 1) == 0) {
        pcVar5 = "";
      }
      fprintf((FILE *)pFile,"%s%s",pcVar5,(pAVar8->field_5).pData);
      return;
    }
    iVar1 = Aig_ObjIsMuxType(pAVar8);
    if (iVar1 != 0) {
      iVar1 = Aig_ObjRecognizeExor(pAVar8,&pFanin0,&pFanin1);
      if (iVar1 == 0) {
        pAVar8 = Aig_ObjRecognizeMux(pAVar8,&pFanin1,&pFanin0);
        pcVar6 = "(";
        if (Level == 0) {
          pcVar6 = "";
        }
        pcVar5 = ")";
        if (Level == 0) {
          pcVar5 = "";
        }
        fputs(pcVar6,(FILE *)pFile);
        iVar1 = Level + 1;
        Aig_ObjPrintVerilog(pFile,pAVar8,vLevels,iVar1);
        fwrite(" ? ",3,1,(FILE *)pFile);
        Aig_ObjPrintVerilog(pFile,(Aig_Obj_t *)((ulong)pFanin1 ^ (ulong)(uVar7 & 1)),vLevels,iVar1);
        fwrite(" : ",3,1,(FILE *)pFile);
        Aig_ObjPrintVerilog(pFile,(Aig_Obj_t *)((ulong)(uVar7 & 1) ^ (ulong)pFanin0),vLevels,iVar1);
      }
      else {
        pcVar6 = "(";
        if (Level == 0) {
          pcVar6 = "";
        }
        pcVar5 = ")";
        if (Level == 0) {
          pcVar5 = "";
        }
        fputs(pcVar6,(FILE *)pFile);
        Aig_ObjPrintVerilog(pFile,(Aig_Obj_t *)((ulong)(uVar7 & 1) ^ (ulong)pFanin0),vLevels,
                            Level + 1);
        fwrite(" ^ ",3,1,(FILE *)pFile);
        Aig_ObjPrintVerilog(pFile,pFanin1,vLevels,Level + 1);
      }
      goto LAB_0050eac9;
    }
    Vec_VecExpand(vLevels,Level);
    pVVar3 = Vec_VecEntry(vLevels,Level);
    Aig_ObjCollectMulti(pAVar8,pVVar3);
    pcVar5 = "(";
    if (Level == 0) {
      pcVar5 = "";
    }
    fputs(pcVar5,(FILE *)pFile);
    local_38 = "|";
    if (((ulong)pObj & 1) == 0) {
      local_38 = "&";
    }
    for (iVar1 = 0; iVar1 < pVVar3->nSize; iVar1 = iVar1 + 1) {
      pvVar4 = Vec_PtrEntry(pVVar3,iVar1);
      Aig_ObjPrintVerilog(pFile,(Aig_Obj_t *)((ulong)pvVar4 ^ (ulong)(uVar7 & 1)),vLevels,Level + 1)
      ;
      if (iVar1 < pVVar3->nSize + -1) {
        fprintf((FILE *)pFile," %s ",local_38);
      }
    }
  }
  pcVar5 = ")";
  if (Level == 0) {
    pcVar5 = "";
  }
LAB_0050eac9:
  fputs(pcVar5,(FILE *)pFile);
  return;
}

Assistant:

void Aig_ObjPrintVerilog( FILE * pFile, Aig_Obj_t * pObj, Vec_Vec_t * vLevels, int Level )
{
    Vec_Ptr_t * vSuper;
    Aig_Obj_t * pFanin, * pFanin0, * pFanin1, * pFaninC;
    int fCompl, i;
    // store the complemented attribute
    fCompl = Aig_IsComplement(pObj);
    pObj = Aig_Regular(pObj);
    // constant case
    if ( Aig_ObjIsConst1(pObj) )
    {
        fprintf( pFile, "1\'b%d", !fCompl );
        return;
    }
    // PI case
    if ( Aig_ObjIsCi(pObj) )
    {
        fprintf( pFile, "%s%s", fCompl? "~" : "", (char*)pObj->pData );
        return;
    }
    // EXOR case
    if ( Aig_ObjIsExor(pObj) )
    {
        Vec_VecExpand( vLevels, Level );
        vSuper = Vec_VecEntry( vLevels, Level );
        Aig_ObjCollectMulti( pObj, vSuper );
        fprintf( pFile, "%s", (Level==0? "" : "(") );
        Vec_PtrForEachEntry( Aig_Obj_t *, vSuper, pFanin, i )
        {
            Aig_ObjPrintVerilog( pFile, Aig_NotCond(pFanin, (fCompl && i==0)), vLevels, Level+1 );
            if ( i < Vec_PtrSize(vSuper) - 1 )
                fprintf( pFile, " ^ " );
        }
        fprintf( pFile, "%s", (Level==0? "" : ")") );
        return;
    }
    // MUX case
    if ( Aig_ObjIsMuxType(pObj) )
    {
        if ( Aig_ObjRecognizeExor( pObj, &pFanin0, &pFanin1 ) )
        {
            fprintf( pFile, "%s", (Level==0? "" : "(") );
            Aig_ObjPrintVerilog( pFile, Aig_NotCond(pFanin0, fCompl), vLevels, Level+1 );
            fprintf( pFile, " ^ " );
            Aig_ObjPrintVerilog( pFile, pFanin1, vLevels, Level+1 );
            fprintf( pFile, "%s", (Level==0? "" : ")") );
        }
        else 
        {
            pFaninC = Aig_ObjRecognizeMux( pObj, &pFanin1, &pFanin0 );
            fprintf( pFile, "%s", (Level==0? "" : "(") );
            Aig_ObjPrintVerilog( pFile, pFaninC, vLevels, Level+1 );
            fprintf( pFile, " ? " );
            Aig_ObjPrintVerilog( pFile, Aig_NotCond(pFanin1, fCompl), vLevels, Level+1 );
            fprintf( pFile, " : " );
            Aig_ObjPrintVerilog( pFile, Aig_NotCond(pFanin0, fCompl), vLevels, Level+1 );
            fprintf( pFile, "%s", (Level==0? "" : ")") );
        }
        return;
    }
    // AND case
    Vec_VecExpand( vLevels, Level );
    vSuper = Vec_VecEntry(vLevels, Level);
    Aig_ObjCollectMulti( pObj, vSuper );
    fprintf( pFile, "%s", (Level==0? "" : "(") );
    Vec_PtrForEachEntry( Aig_Obj_t *, vSuper, pFanin, i )
    {
        Aig_ObjPrintVerilog( pFile, Aig_NotCond(pFanin, fCompl), vLevels, Level+1 );
        if ( i < Vec_PtrSize(vSuper) - 1 )
            fprintf( pFile, " %s ", fCompl? "|" : "&" );
    }
    fprintf( pFile, "%s", (Level==0? "" : ")") );
    return;
}